

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int32 vector_normalize(vector_t v,uint32 dim)

{
  int32 iVar1;
  ulong uVar2;
  double dVar3;
  
  dVar3 = 0.0;
  for (uVar2 = 0; dim != uVar2; uVar2 = uVar2 + 1) {
    dVar3 = dVar3 + (double)(float)v[uVar2];
  }
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    iVar1 = 0;
    for (uVar2 = 0; dim != uVar2; uVar2 = uVar2 + 1) {
      v[uVar2] = (float32)((float)v[uVar2] / (float)dVar3);
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int
vector_normalize(vector_t v, uint32 dim)
{
    uint32 i;
    float64 s;
    int ret_val = S3_SUCCESS;

    for (i = 0, s = 0; i < dim; i++)
        s += v[i];

    if (s != 0) {
        for (i = 0; i < dim; i++)
            v[i] /= (float) s;
    }
    else {
        ret_val = S3_WARNING;
    }

    return ret_val;
}